

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest05VerifyingPathswithSelfIssuedCertificates_::
Section5InvalidBasicSelfIssuedCRLSigningKeyTest8<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section5InvalidBasicSelfIssuedCRLSigningKeyTest8<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.5.8";
  local_88.should_validate = false;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<4ul,3ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005a17e0,(char *(*) [4])&PTR_anon_var_dwarf_28895f_005a1800,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest05VerifyingPathswithSelfIssuedCertificates,
                     Section5InvalidBasicSelfIssuedCRLSigningKeyTest8) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "BasicSelfIssuedCRLSigningKeyCACert",
                               "BasicSelfIssuedCRLSigningKeyCRLCert",
                               "InvalidBasicSelfIssuedCRLSigningKeyTest8EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "BasicSelfIssuedCRLSigningKeyCRLCertCRL",
                              "BasicSelfIssuedCRLSigningKeyCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.5.8";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}